

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

PathDeclarationSyntax * __thiscall slang::parsing::Parser::parsePathDeclaration(Parser *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  PathDescriptionSyntax *pPVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  pointer pTVar8;
  ExpressionSyntax *pEVar9;
  EdgeSensitivePathSuffixSyntax *suffix;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar10;
  SourceLocation SVar11;
  SourceLocation SVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PathDeclarationSyntax *pPVar14;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar15;
  __extent_storage<18446744073709551615UL> _Var16;
  Info *pIVar17;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  TokenKind TVar18;
  TokenKind kind;
  variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *__v;
  ulong uVar19;
  SourceRange range;
  SourceRange range_00;
  Token TVar20;
  Token TVar21;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> sVar22;
  Token TVar23;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar24;
  string_view sVar25;
  SourceRange SVar26;
  Token openParen;
  Token openParen_00;
  Token edgeIdentifier;
  Token equals;
  Token polarityOperator;
  Token valueCloseParen;
  Token valueOpenParen;
  Token first;
  Token local_2d0;
  undefined8 local_2c0;
  PathDescriptionSyntax *local_2b8;
  __extent_storage<18446744073709551615UL> local_2b0;
  Token local_2a8;
  Info *local_298;
  Token local_290;
  Token local_280;
  Token local_270;
  undefined8 local_260;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_258;
  ulong local_248;
  undefined8 uStack_240;
  ulong local_238;
  long local_230;
  ulong local_228;
  Token local_220;
  Info *local_210;
  undefined8 local_208;
  pointer local_200;
  undefined8 local_1f8;
  pointer local_1f0;
  Token local_1e8;
  Token local_1d8;
  undefined1 local_1c8 [24];
  undefined1 auStack_1b0 [16];
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> sStack_1a0;
  undefined8 uVar7;
  long lVar13;
  
  TVar20 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  uVar7 = TVar20._0_8_;
  TVar21 = parseEdgeKeyword(this);
  local_298 = TVar21.info;
  sVar22 = parsePathTerminals(this);
  local_2b0 = sVar22._M_extent._M_extent_value;
  pTVar8 = sVar22._M_ptr;
  TVar23 = ParserBase::peek(&this->super_ParserBase);
  if ((TVar23.kind == Minus) || (TVar23.kind == Plus)) {
    local_290 = ParserBase::consume(&this->super_ParserBase);
  }
  else {
    Token::Token((Token *)local_1c8);
    local_290 = (Token)local_1c8._0_16_;
  }
  Token::Token(&local_2d0);
  local_2c0 = TVar21._0_8_;
  local_2b8 = (PathDescriptionSyntax *)TVar20.info;
  if ((local_290.info == (Info *)0x0) &&
     ((bVar5 = ParserBase::peek(&this->super_ParserBase,PlusEqual), bVar5 ||
      (bVar5 = ParserBase::peek(&this->super_ParserBase,MinusEqual), bVar5)))) {
    local_290 = ParserBase::consume(&this->super_ParserBase);
    local_2d0 = ParserBase::consumeIf(&this->super_ParserBase,GreaterThan);
    if (local_2d0.info == (Info *)0x0) {
      SVar11 = Token::location(&local_290);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x4b0005,
                          (SourceLocation)
                          ((long)SVar11 * 0x10 + 0x100000000 >> 4 & 0xfffffffff0000000U |
                          (ulong)(SVar11._0_4_ & 0xfffffff)));
      local_1c8._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
      SVar11 = Token::location((Token *)local_1c8);
      kind = GreaterThan;
LAB_003b7d5b:
      local_2d0 = ParserBase::missingToken(&this->super_ParserBase,kind,SVar11);
    }
    else {
      sVar24 = Token::trivia(&local_2d0);
      if (sVar24._M_extent._M_extent_value._M_extent_value != 0) {
        SVar11 = Token::location(&local_290);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x4b0005,
                            (SourceLocation)
                            ((long)SVar11 * 0x10 + 0x100000000 >> 4 & 0xfffffffff0000000U |
                            (ulong)(SVar11._0_4_ & 0xfffffff)));
      }
    }
LAB_003b7d6d:
    _Var16._M_extent_value = local_2b0._M_extent_value;
    if (2 < local_2b0._M_extent_value) {
      ppSVar10 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            (pTVar8 + 2));
      local_1c8._0_16_ = (undefined1  [16])slang::syntax::SyntaxNode::getFirstToken(*ppSVar10);
      ppSVar10 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            (pTVar8 + (_Var16._M_extent_value - 1)));
      local_258._M_first._M_storage =
           (_Uninitialized<slang::parsing::Token,_true>)
           slang::syntax::SyntaxNode::getLastToken(*ppSVar10);
      SVar11 = Token::location((Token *)local_1c8);
      SVar12 = Token::location(&local_258._M_first._M_storage);
      sVar25 = Token::rawText(&local_258._M_first._M_storage);
      SVar26.endLoc = (SourceLocation)((long)SVar12 + sVar25._M_len * 0x10000000);
      SVar26.startLoc = SVar11;
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x820005,SVar26);
    }
    bVar5 = false;
  }
  else {
    TVar20 = ParserBase::peek(&this->super_ParserBase);
    if (TVar20.kind == EqualsArrow) {
      local_2d0 = ParserBase::consume(&this->super_ParserBase);
      goto LAB_003b7d6d;
    }
    if (TVar20.kind != StarArrow) {
      local_1c8._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
      SVar11 = Token::location((Token *)local_1c8);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x4b0005,SVar11);
      local_1c8._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
      SVar11 = Token::location((Token *)local_1c8);
      kind = EqualsArrow;
      goto LAB_003b7d5b;
    }
    local_2d0 = ParserBase::consume(&this->super_ParserBase);
    bVar5 = true;
  }
  bVar4 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
  local_1f0 = pTVar8;
  if (bVar4) {
    local_1f8 = uVar7;
    TVar20 = ParserBase::consume(&this->super_ParserBase);
    local_210 = TVar20.info;
    local_208 = TVar20._0_8_;
    sVar22 = parsePathTerminals(this);
    _Var16 = sVar22._M_extent._M_extent_value;
    local_200 = sVar22._M_ptr;
    TVar20 = ParserBase::peek(&this->super_ParserBase);
    if ((TVar20.kind == Minus) || (TVar20.kind == Plus)) {
      TVar20 = ParserBase::consume(&this->super_ParserBase);
    }
    else {
      Token::Token((Token *)local_1c8);
      TVar20 = (Token)local_1c8._0_16_;
    }
    Token::Token(&local_2a8);
    if ((TVar20.info == (Info *)0x0) &&
       ((bVar4 = ParserBase::peek(&this->super_ParserBase,PlusColon), bVar4 ||
        (bVar4 = ParserBase::peek(&this->super_ParserBase,MinusColon), bVar4)))) {
      TVar20 = ParserBase::consume(&this->super_ParserBase);
    }
    else {
      local_260 = TVar20._0_8_;
      local_2a8 = ParserBase::expect(&this->super_ParserBase,Colon);
      TVar20.info = TVar20.info;
      TVar20.kind = (undefined2)local_260;
      TVar20._2_1_ = local_260._2_1_;
      TVar20.numFlags.raw = local_260._3_1_;
      TVar20.rawLen = local_260._4_4_;
    }
    local_260 = TVar20._0_8_;
    pEVar9 = parseExpression(this);
    local_1d8 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    pTVar8 = local_200;
    local_1c8._8_4_ = 3;
    local_1c8._16_8_ = (SyntaxNode *)0x0;
    auStack_1b0._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
    local_1c8._0_8_ = &PTR_getChild_005ca810;
    sStack_1a0._M_extent._M_extent_value = _Var16._M_extent_value;
    sStack_1a0._M_ptr = local_200;
    openParen.info = local_210;
    openParen.kind = (undefined2)local_208;
    openParen._2_1_ = local_208._2_1_;
    openParen.numFlags.raw = local_208._3_1_;
    openParen.rawLen = local_208._4_4_;
    polarityOperator.info = TVar20.info;
    polarityOperator.kind = (undefined2)local_260;
    polarityOperator._2_1_ = local_260._2_1_;
    polarityOperator.numFlags.raw = local_260._3_1_;
    polarityOperator.rawLen = local_260._4_4_;
    auStack_1b0._8_8_ = _Var16._M_extent_value;
    suffix = slang::syntax::SyntaxFactory::edgeSensitivePathSuffix
                       (&this->factory,openParen,
                        (SeparatedSyntaxList<slang::syntax::NameSyntax> *)local_1c8,polarityOperator
                        ,local_2a8,pEVar9,local_1d8);
    uVar7 = local_1f8;
    if (!bVar5 && 2 < _Var16._M_extent_value) {
      ppSVar10 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            (pTVar8 + 2));
      local_1c8._0_16_ = (undefined1  [16])slang::syntax::SyntaxNode::getFirstToken(*ppSVar10);
      ppSVar10 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            (pTVar8 + (_Var16._M_extent_value - 1)));
      local_258._M_first._M_storage =
           (_Uninitialized<slang::parsing::Token,_true>)
           slang::syntax::SyntaxNode::getLastToken(*ppSVar10);
      SVar11 = Token::location((Token *)local_1c8);
      SVar12 = Token::location(&local_258._M_first._M_storage);
      sVar25 = Token::rawText(&local_258._M_first._M_storage);
      range_00.endLoc = (SourceLocation)((long)SVar12 + sVar25._M_len * 0x10000000);
      range_00.startLoc = SVar11;
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x820005,range_00);
      uVar7 = local_1f8;
    }
  }
  else {
    sStack_1a0 = parsePathTerminals(this);
    _Var16 = sStack_1a0._M_extent._M_extent_value;
    pTVar8 = sStack_1a0._M_ptr;
    local_1c8._8_4_ = 3;
    local_1c8._16_8_ = (SyntaxNode *)0x0;
    auStack_1b0._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
    local_1c8._0_8_ = &PTR_getChild_005ca810;
    auStack_1b0._8_8_ = _Var16._M_extent_value;
    suffix = (EdgeSensitivePathSuffixSyntax *)
             slang::syntax::SyntaxFactory::simplePathSuffix
                       (&this->factory,(SeparatedSyntaxList<slang::syntax::NameSyntax> *)local_1c8);
    if (!bVar5 && 2 < _Var16._M_extent_value) {
      ppSVar10 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            (pTVar8 + 2));
      local_1c8._0_16_ = (undefined1  [16])slang::syntax::SyntaxNode::getFirstToken(*ppSVar10);
      ppSVar10 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            (pTVar8 + (_Var16._M_extent_value - 1)));
      local_258._M_first._M_storage =
           (_Uninitialized<slang::parsing::Token,_true>)
           slang::syntax::SyntaxNode::getLastToken(*ppSVar10);
      SVar11 = Token::location((Token *)local_1c8);
      SVar12 = Token::location(&local_258._M_first._M_storage);
      sVar25 = Token::rawText(&local_258._M_first._M_storage);
      range.endLoc = (SourceLocation)((long)SVar12 + sVar25._M_len * 0x10000000);
      range.startLoc = SVar11;
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x820005,range);
    }
  }
  pPVar3 = local_2b8;
  uVar1 = local_2c0;
  local_1e8 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  uVar2 = local_2c0;
  local_1c8._8_4_ = 3;
  local_1c8._16_8_ = (SyntaxNode *)0x0;
  auStack_1b0._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
  auStack_1b0._8_8_ = local_2b0._M_extent_value;
  local_1c8._0_8_ = &PTR_getChild_005ca810;
  sStack_1a0._M_extent._M_extent_value = local_2b0._M_extent_value;
  sStack_1a0._M_ptr = local_1f0;
  openParen_00.info = (Info *)pPVar3;
  openParen_00.kind = (short)uVar7;
  openParen_00._2_1_ = (char)((ulong)uVar7 >> 0x10);
  openParen_00.numFlags.raw = (char)((ulong)uVar7 >> 0x18);
  openParen_00.rawLen = (int)((ulong)uVar7 >> 0x20);
  edgeIdentifier.info = local_298;
  local_2c0._0_2_ = (undefined2)uVar1;
  local_2c0._2_1_ = SUB81(uVar1,2);
  local_2c0._3_1_ = SUB81(uVar1,3);
  local_2c0._4_4_ = SUB84(uVar1,4);
  edgeIdentifier.kind = (undefined2)local_2c0;
  edgeIdentifier._2_1_ = local_2c0._2_1_;
  edgeIdentifier.numFlags.raw = local_2c0._3_1_;
  edgeIdentifier.rawLen = local_2c0._4_4_;
  local_2c0 = uVar2;
  local_2b0._M_extent_value = (size_t)&this->factory;
  local_2b8 = slang::syntax::SyntaxFactory::pathDescription
                        (&this->factory,openParen_00,edgeIdentifier,
                         (SeparatedSyntaxList<slang::syntax::NameSyntax> *)local_1c8,local_290,
                         local_2d0,&suffix->super_PathSuffixSyntax,local_1e8);
  TVar20 = ParserBase::expect(&this->super_ParserBase,Equals);
  local_298 = TVar20.info;
  local_2c0 = TVar20._0_8_;
  Token::Token(&local_270);
  Token::Token(&local_220);
  Token::Token(&local_280);
  bVar5 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
  if (bVar5) {
    local_220 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
    if ((local_220._0_4_ >> 0x10 & 1) == 0) {
      local_1c8._8_8_ = 0;
      local_1c8._0_8_ = auStack_1b0;
      local_1c8._16_8_ = (SyntaxNode *)0x10;
      TVar21 = ParserBase::peek(&this->super_ParserBase);
      local_2a8 = TVar21;
      bVar5 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar21.kind);
      if (bVar5) {
        bVar5 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
        if (!bVar5) {
          SVar11 = Token::location(&local_2a8);
          ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar11);
        }
LAB_003b84f1:
        local_280 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
        pIVar17 = local_280.info;
      }
      else {
        bVar5 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(TVar21.kind);
        if (bVar5) {
          pEVar9 = parseMinTypMaxExpression
                             (this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
          local_258._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar9;
          local_248 = CONCAT71(local_248._1_7_,1);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (TokenOrSyntax *)&local_258._M_first);
          TVar20 = ParserBase::peek(&this->super_ParserBase);
          uVar7 = TVar20._0_8_;
          bVar5 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar20.kind);
          if (TVar20.kind != EndOfFile && !bVar5) {
            do {
              if ((short)uVar7 != 0x18) {
                ParserBase::expect(&this->super_ParserBase,Comma);
                do {
                  bVar5 = ParserBase::
                          skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                    (&this->super_ParserBase,(DiagCode)0x10001,false);
                  if (!bVar5) goto LAB_003b84f1;
                  bVar5 = ParserBase::peek(&this->super_ParserBase,Comma);
                } while (!bVar5);
              }
              local_258._M_first._M_storage =
                   (_Uninitialized<slang::parsing::Token,_true>)
                   ParserBase::expect(&this->super_ParserBase,Comma);
              local_248 = local_248 & 0xffffffffffffff00;
              SmallVectorBase<slang::syntax::TokenOrSyntax>::
              emplace_back<slang::syntax::TokenOrSyntax>
                        ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                         (TokenOrSyntax *)&local_258._M_first);
              TVar20 = ParserBase::peek(&this->super_ParserBase);
              TVar18 = TVar20.kind;
              bVar5 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar18);
              if (TVar18 == EndOfFile || bVar5) {
                ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
                break;
              }
              if ((TVar21.info == TVar20.info && TVar21.kind == TVar18) &&
                 (bVar5 = ParserBase::
                          skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                    (&this->super_ParserBase,(DiagCode)0x10001,true), !bVar5))
              break;
              pEVar9 = parseMinTypMaxExpression
                                 (this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
              local_258._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar9;
              local_248 = CONCAT71(local_248._1_7_,1);
              SmallVectorBase<slang::syntax::TokenOrSyntax>::
              emplace_back<slang::syntax::TokenOrSyntax>
                        ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                         (TokenOrSyntax *)&local_258._M_first);
              TVar23 = ParserBase::peek(&this->super_ParserBase);
              uVar7 = TVar23._0_8_;
              bVar5 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar23.kind);
              uVar19 = TVar20._0_8_ & 0xffffffff;
              TVar21.info = TVar20.info;
              TVar21.kind = (short)uVar19;
              TVar21._2_1_ = (char)(uVar19 >> 0x10);
              TVar21.numFlags.raw = (char)(uVar19 >> 0x18);
              TVar21.rawLen = (int)(uVar19 >> 0x20);
            } while (TVar23.kind != EndOfFile && !bVar5);
          }
          goto LAB_003b84f1;
        }
        ParserBase::reportMissingList
                  (&this->super_ParserBase,TVar21,CloseParenthesis,&local_280,(DiagCode)0x10001);
        pIVar17 = extraout_RDX_00;
      }
      iVar6 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                        ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                         (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar17);
      lVar13 = CONCAT44(extraout_var,iVar6);
      uVar19 = extraout_RDX_01;
      if ((pointer)local_1c8._0_8_ != (pointer)auStack_1b0) {
        operator_delete((void *)local_1c8._0_8_);
      }
    }
    else {
      SVar11 = Token::location(&local_220);
      local_280 = ParserBase::missingToken(&this->super_ParserBase,CloseParenthesis,SVar11);
      lVar13 = 0;
      uVar19 = 0;
    }
    local_270 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    goto LAB_003b8727;
  }
  local_1c8._8_8_ = 0;
  local_1c8._0_8_ = auStack_1b0;
  local_1c8._16_8_ = (SyntaxNode *)0x4;
  TVar23 = ParserBase::peek(&this->super_ParserBase);
  local_2a8 = TVar23;
  bVar5 = slang::syntax::SyntaxFacts::isSemicolon(TVar23.kind);
  if (bVar5) {
    bVar5 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar5) {
      SVar11 = Token::location(&local_2a8);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar11);
    }
LAB_003b86da:
    local_270 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    pIVar17 = local_270.info;
  }
  else {
    bVar5 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(TVar23.kind);
    if (bVar5) {
      pEVar9 = parseMinTypMaxExpression
                         (this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
      local_258._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar9;
      local_248 = CONCAT71(local_248._1_7_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                 (TokenOrSyntax *)&local_258._M_first);
      TVar20 = ParserBase::peek(&this->super_ParserBase);
      bVar5 = slang::syntax::SyntaxFacts::isSemicolon(TVar20.kind);
      if (TVar20.kind == Comma && !bVar5) {
        do {
          local_258._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,Comma);
          local_248 = local_248 & 0xffffffffffffff00;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (TokenOrSyntax *)&local_258._M_first);
          TVar20 = ParserBase::peek(&this->super_ParserBase);
          TVar18 = TVar20.kind;
          bVar5 = slang::syntax::SyntaxFacts::isSemicolon(TVar18);
          if (TVar18 == EndOfFile || bVar5) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            break;
          }
          if ((TVar23.info == TVar20.info && TVar23.kind == TVar18) &&
             (bVar5 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isSemicolon>
                                (&this->super_ParserBase,(DiagCode)0x10001,true), !bVar5)) break;
          pEVar9 = parseMinTypMaxExpression
                             (this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
          local_258._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar9;
          local_248 = CONCAT71(local_248._1_7_,1);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (TokenOrSyntax *)&local_258._M_first);
          TVar21 = ParserBase::peek(&this->super_ParserBase);
          bVar5 = slang::syntax::SyntaxFacts::isSemicolon(TVar21.kind);
          uVar19 = TVar20._0_8_ & 0xffffffff;
          TVar23.info = TVar20.info;
          TVar23.kind = (short)uVar19;
          TVar23._2_1_ = (char)(uVar19 >> 0x10);
          TVar23.numFlags.raw = (char)(uVar19 >> 0x18);
          TVar23.rawLen = (int)(uVar19 >> 0x20);
        } while (TVar21.kind == Comma && !bVar5);
      }
      goto LAB_003b86da;
    }
    ParserBase::reportMissingList
              (&this->super_ParserBase,TVar23,Semicolon,&local_270,(DiagCode)0x10001);
    pIVar17 = extraout_RDX;
  }
  iVar6 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar17);
  lVar13 = CONCAT44(extraout_var_00,iVar6);
  uVar19 = extraout_RDX_02;
  if ((pointer)local_1c8._0_8_ != (pointer)auStack_1b0) {
    operator_delete((void *)local_1c8._0_8_);
  }
LAB_003b8727:
  if ((0x17 < uVar19) || ((0x80082bUL >> (uVar19 & 0x3f) & 1) == 0)) {
    __v = (variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
          (lVar13 + (uVar19 - 1) * 0x18);
    if (*(char *)(lVar13 + (uVar19 - 1) * 0x18 + 0x10) == '\x01') {
      ppSVar10 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(__v);
      SVar26 = slang::syntax::SyntaxNode::sourceRange(*ppSVar10);
    }
    else {
      pvVar15 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>(__v);
      local_1c8._0_16_ = *(undefined1 (*) [16])pvVar15;
      SVar26 = Token::range((Token *)local_1c8);
    }
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xbf0005,SVar26);
  }
  local_1c8._8_4_ = 1;
  local_1c8._16_8_ = (SyntaxNode *)0x0;
  auStack_1b0._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
  auStack_1b0._8_8_ = (Info *)0x0;
  sStack_1a0 = (span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>)ZEXT816(0);
  local_1c8._0_8_ = &PTR_getChild_005c7a10;
  local_258._8_4_ = 3;
  local_248 = 0;
  uStack_240 = 0;
  local_258._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_005caa00;
  equals.info = local_298;
  equals.kind = (undefined2)local_2c0;
  equals._2_1_ = local_2c0._2_1_;
  equals.numFlags.raw = local_2c0._3_1_;
  equals.rawLen = local_2c0._4_4_;
  local_238 = uVar19;
  local_230 = lVar13;
  local_228 = uVar19;
  pPVar14 = slang::syntax::SyntaxFactory::pathDeclaration
                      ((SyntaxFactory *)local_2b0._M_extent_value,
                       (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_1c8,local_2b8,
                       equals,local_220,
                       (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)&local_258._M_first,
                       local_280,local_270);
  return pPVar14;
}

Assistant:

PathDeclarationSyntax& Parser::parsePathDeclaration() {
    auto parsePolarity = [&] {
        switch (peek().kind) {
            case TokenKind::Plus:
            case TokenKind::Minus:
                return consume();
            default:
                return Token();
        }
    };

    auto checkTerminals = [&](std::span<TokenOrSyntax> terminals, bool isFull) {
        if (!isFull && terminals.size() > 2) {
            Token first = terminals[2].node()->getFirstToken();
            Token last = terminals.back().node()->getLastToken();
            addDiag(diag::MultipleParallelTerminals,
                    SourceRange{first.location(), last.location() + last.rawText().length()});
        }
    };

    auto openParen = expect(TokenKind::OpenParenthesis);
    auto edge = parseEdgeKeyword();
    auto inputs = parsePathTerminals();
    auto polarity = parsePolarity();

    // In specify blocks, +=> (and -=>) should be parsed as '+' and '=>',
    // but of course the lexer tokenizes it as '+=' and '>' so we need to
    // work around that here.
    Token op;
    bool isFull = false;
    if (!polarity && (peek(TokenKind::PlusEqual) || peek(TokenKind::MinusEqual))) {
        polarity = consume();
        op = consumeIf(TokenKind::GreaterThan);
        if (!op) {
            addDiag(diag::ExpectedPathOp, polarity.location() + 1);
            op = missingToken(TokenKind::GreaterThan, peek().location());
        }
        else if (!op.trivia().empty()) {
            addDiag(diag::ExpectedPathOp, polarity.location() + 1);
        }
    }
    else {
        switch (peek().kind) {
            case TokenKind::StarArrow:
                isFull = true;
                op = consume();
                break;
            case TokenKind::EqualsArrow:
                op = consume();
                break;
            default:
                addDiag(diag::ExpectedPathOp, peek().location());
                op = missingToken(TokenKind::EqualsArrow, peek().location());
                break;
        }
    }

    checkTerminals(inputs, isFull);

    PathSuffixSyntax* suffix;
    if (peek(TokenKind::OpenParenthesis)) {
        auto suffixOpenParen = consume();
        auto outputs = parsePathTerminals();
        auto polarity2 = parsePolarity();

        // The polarity we just tried to parse could have been a '+' or a '-' next
        // to the expected colon, which would get lexed together as a single token.
        // In that case don't bother trying to find another colon token.
        Token colon;
        if (!polarity2 && (peek(TokenKind::PlusColon) || peek(TokenKind::MinusColon)))
            polarity2 = consume();
        else
            colon = expect(TokenKind::Colon);

        auto& expr = parseExpression();
        auto suffixCloseParen = expect(TokenKind::CloseParenthesis);
        suffix = &factory.edgeSensitivePathSuffix(suffixOpenParen, outputs, polarity2, colon, expr,
                                                  suffixCloseParen);

        checkTerminals(outputs, isFull);
    }
    else {
        auto outputs = parsePathTerminals();
        suffix = &factory.simplePathSuffix(outputs);
        checkTerminals(outputs, isFull);
    }

    auto closeParen = expect(TokenKind::CloseParenthesis);
    auto& desc = factory.pathDescription(openParen, edge, inputs, polarity, op, *suffix,
                                         closeParen);

    auto equals = expect(TokenKind::Equals);

    Token semi;
    Token valueOpenParen, valueCloseParen;
    std::span<TokenOrSyntax> delays;

    if (peek(TokenKind::OpenParenthesis)) {
        parseList<isPossibleExpressionOrComma, isEndOfParenList>(
            TokenKind::OpenParenthesis, TokenKind::CloseParenthesis, TokenKind::Comma,
            valueOpenParen, delays, valueCloseParen, RequireItems::True, diag::ExpectedExpression,
            [this] { return &parseMinTypMaxExpression(); });
        semi = expect(TokenKind::Semicolon);
    }
    else {
        SmallVector<TokenOrSyntax, 4> buffer;
        parseList<isPossibleExpressionOrComma, isSemicolon>(
            buffer, TokenKind::Semicolon, TokenKind::Comma, semi, RequireItems::True,
            diag::ExpectedExpression, [this] { return &parseMinTypMaxExpression(); });
        delays = buffer.copy(alloc);
    }

    if (delays.size() > 0 && delays.size() != 1 && delays.size() != 3 && delays.size() != 5 &&
        delays.size() != 11 && delays.size() != 23) {
        auto& lastDelay = delays.back();
        auto range = lastDelay.isNode() ? lastDelay.node()->sourceRange()
                                        : lastDelay.token().range();
        addDiag(diag::WrongSpecifyDelayCount, range);
    }

    return factory.pathDeclaration(nullptr, desc, equals, valueOpenParen, delays, valueCloseParen,
                                   semi);
}